

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePiece.cc
# Opt level: O3

vector<onmt::Token,_std::allocator<onmt::Token>_> * __thiscall
onmt::SentencePiece::encode_and_annotate
          (vector<onmt::Token,_std::allocator<onmt::Token>_> *__return_storage_ptr__,
          SentencePiece *this,Token *token,bool training)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pTVar2;
  pointer pTVar3;
  bool bVar4;
  undefined7 in_register_00000009;
  bool bVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer pbVar7;
  Token sub_token;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pieces;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  Token local_c0;
  Token *local_78;
  pointer local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  ulong local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (*(this->super_SubwordEncoder)._vptr_SubwordEncoder[6])
            (&local_48,this,token,CONCAT71(in_register_00000009,training));
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::vector
              (__return_storage_ptr__,1,token,(allocator_type *)&local_c0);
  }
  else {
    (__return_storage_ptr__->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78 = token;
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::reserve
              (__return_storage_ptr__,
               (long)local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    local_70 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      paVar1 = &local_c0.surface.field_2;
      bVar5 = false;
      paVar6 = &(local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        bVar4 = starts_with((string *)(paVar6 + -1),(string *)sp_marker_abi_cxx11_);
        if (bVar4) {
          bVar4 = true;
          if (*(size_type *)((long)paVar6 + -8) != sp_marker_abi_cxx11_._8_8_) {
            std::__cxx11::string::substr((ulong)&local_68,(ulong)(paVar6 + -1));
            if (local_68 == &local_58) {
              local_c0.surface.field_2._8_8_ = local_58._8_8_;
              local_c0.surface._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_c0.surface._M_dataplus._M_p = (pointer)local_68;
            }
            local_c0.surface.field_2._M_allocated_capacity._1_7_ =
                 local_58._M_allocated_capacity._1_7_;
            local_c0.surface.field_2._M_local_buf[0] = local_58._M_local_buf[0];
            local_c0.surface._M_string_length = local_60;
            local_60 = 0;
            local_58._M_local_buf[0] = '\0';
            local_c0.features.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_c0.features.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_c0.features.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_c0.type = Word;
            local_c0.casing = None;
            local_c0.join_left = false;
            local_c0.join_right = false;
            local_c0.spacer = true;
            local_c0.preserve = false;
            local_68 = &local_58;
            std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
                      (__return_storage_ptr__,&local_c0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_c0.features);
            bVar4 = bVar5;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0.surface._M_dataplus._M_p != paVar1) {
              operator_delete(local_c0.surface._M_dataplus._M_p,
                              local_c0.surface.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar6 + -1))->_M_dataplus)._M_p;
          if (paVar6 == local_e0) {
            local_d0._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_d0._8_8_ = *(ulong *)((long)paVar6 + 8);
            local_e0 = &local_d0;
          }
          else {
            local_d0._M_allocated_capacity = paVar6->_M_allocated_capacity;
          }
          local_c0.surface._M_string_length = *(size_type *)((long)paVar6 + -8);
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar6 + -1))->
          _M_dataplus)._M_p = (pointer)paVar6;
          *(ulong *)((long)paVar6 + -8) = 0;
          paVar6->_M_local_buf[0] = '\0';
          if (local_e0 == &local_d0) {
            local_c0.surface.field_2._8_8_ = local_d0._8_8_;
            local_c0.surface._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_c0.surface._M_dataplus._M_p = (pointer)local_e0;
          }
          local_c0.surface.field_2._M_allocated_capacity = local_d0._M_allocated_capacity;
          local_d0._M_allocated_capacity = local_d0._M_allocated_capacity & 0xffffffffffffff00;
          local_c0.features.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_c0.features.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_c0.features.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c0.type = Word;
          local_c0.casing = None;
          local_c0.join_left = false;
          local_c0.join_right = false;
          local_c0.spacer = false;
          local_c0.preserve = false;
          if (bVar5) {
            local_c0.join_left = false;
            local_c0.join_right = false;
            local_c0.spacer = true;
            local_c0.preserve = true;
          }
          else if ((__return_storage_ptr__->
                   super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                   super__Vector_impl_data._M_start !=
                   (__return_storage_ptr__->
                   super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                   super__Vector_impl_data._M_finish) {
            local_c0.join_left = true;
            local_c0.join_right = false;
            local_c0.spacer = false;
            local_c0.preserve = false;
          }
          std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
                    (__return_storage_ptr__,&local_c0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_c0.features);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.surface._M_dataplus._M_p != paVar1) {
            operator_delete(local_c0.surface._M_dataplus._M_p,
                            local_c0.surface.field_2._M_allocated_capacity + 1);
          }
          bVar4 = false;
        }
        bVar5 = bVar4;
        pbVar7 = (pointer)(paVar6 + 1);
        paVar6 = paVar6 + 2;
      } while (pbVar7 != local_70);
    }
    pTVar2 = (__return_storage_ptr__->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (__return_storage_ptr__->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = local_78->join_left;
    pTVar2->join_left = bVar5;
    bVar4 = local_78->join_right;
    pTVar3[-1].join_right = bVar4;
    if ((bVar5 != false) && (local_78->preserve == true)) {
      pTVar2->preserve = true;
    }
    if ((bVar4 != false) && (local_78->preserve == true)) {
      pTVar3[-1].preserve = true;
    }
    SubwordEncoder::propagate_token_properties(local_78,__return_storage_ptr__);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Token> SentencePiece::encode_and_annotate(const Token& token, bool training) const
  {
    std::vector<std::string> pieces = encode(token.surface, training);

    // SentencePiece sometimes returns no pieces for a non empty input. In this case
    // we simply return the original token.
    if (pieces.empty())
      return std::vector<Token>(1, token);

    std::vector<Token> tokens;
    tokens.reserve(pieces.size());
    bool apply_spacer_on_next = false;

    for (auto& piece : pieces)
    {
      // Prefixed by the spacer.
      if (starts_with(piece, sp_marker))
      {
        if (piece.length() == sp_marker.length())  // Piece is just the spacer.
        {
          // Skip this isolated spacer and mark the next piece with the spacer flag.
          apply_spacer_on_next = true;
          continue;
        }
        else
        {
          Token sub_token(piece.substr(sp_marker.length()));
          sub_token.spacer = true;
          tokens.emplace_back(std::move(sub_token));
        }
      }
      else
      {
        Token sub_token(std::move(piece));
        if (apply_spacer_on_next)
        {
          sub_token.spacer = true;
          sub_token.preserve = true;  // The spacer was not attached to this piece so preserve it.
          apply_spacer_on_next = false;
        }
        else if (!tokens.empty())
        {
          sub_token.join_left = true;  // No spacer means it should be joined with the previous subtoken.
        }
        tokens.emplace_back(std::move(sub_token));
      }
    }

    auto& first = tokens.front();
    auto& last = tokens.back();
    first.join_left = token.join_left;
    last.join_right = token.join_right;
    if (token.join_left && token.preserve)
      first.preserve = true;
    if (token.join_right && token.preserve)
      last.preserve = true;

    propagate_token_properties(token, tokens);
    return tokens;
  }